

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::CanClearByZeroing(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  uint uVar2;
  string_view name;
  long lVar3;
  bool bVar4;
  byte bVar5;
  Descriptor *descriptor;
  ulong uVar6;
  byte bVar7;
  undefined1 *puVar8;
  char *pcVar9;
  undefined1 uStack_d8;
  undefined7 uStack_d7;
  string sStack_c8;
  AlphaNum AStack_a8;
  AlphaNum AStack_78;
  
  FVar1 = field[1];
  bVar4 = (bool)(((byte)FVar1 & 0x20) >> 5);
  if (0xbf < (byte)FVar1 != bVar4) {
    uVar6 = (ulong)bVar4;
    CanClearByZeroing();
    bVar7 = *(byte *)(uVar6 + 1);
    bVar5 = (bVar7 & 0x20) >> 5;
    if (0xbf < bVar7 == (bool)bVar5) {
      if (((bVar7 & 0x28) == 0) &&
         (uVar2 = *(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)*(byte *)(uVar6 + 2) * 4), uVar2 < 0xb)) {
        bVar7 = (byte)(0x5fe >> ((byte)uVar2 & 0x1f));
      }
      else {
        bVar7 = 0;
      }
      return (bool)(bVar7 & 1);
    }
    uVar6 = (ulong)(0xbf < bVar7);
    HasTrivialSwap();
    pcVar9 = (char *)0x0;
    uStack_d8 = 0;
    puVar8 = &uStack_d8;
    if (*(cpp **)(uVar6 + 0x18) != (cpp *)0x0) {
      ClassName_abi_cxx11_(&sStack_c8,*(cpp **)(uVar6 + 0x18),descriptor);
      AStack_a8.piece_._M_len = sStack_c8._M_string_length;
      AStack_a8.piece_._M_str = sStack_c8._M_dataplus._M_p;
      AStack_78.piece_._M_len = 1;
      AStack_78.piece_._M_str = "_";
      absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff18,&AStack_a8,&AStack_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_c8._M_dataplus._M_p != &sStack_c8.field_2) {
        operator_delete(sStack_c8._M_dataplus._M_p,sStack_c8.field_2._M_allocated_capacity + 1);
      }
    }
    AStack_a8.piece_._M_str = (char *)**(undefined8 **)(uVar6 + 8);
    AStack_a8.piece_._M_len = (*(undefined8 **)(uVar6 + 8))[1];
    absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff18,&AStack_a8);
    if (*(char *)(*(long *)(uVar6 + 0x20) + 0x53) == '\x01') {
      AStack_a8.piece_._M_len = 9;
      AStack_a8.piece_._M_str = "_DoNotUse";
      absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff18,&AStack_a8);
    }
    name._M_str = pcVar9;
    name._M_len = (size_t)puVar8;
    ResolveKeyword_abi_cxx11_(name);
    if (puVar8 != &uStack_d8) {
      operator_delete(puVar8,CONCAT71(uStack_d7,uStack_d8) + 1);
    }
    return (bool)bVar5;
  }
  if (((byte)FVar1 & 0x28) != 0) {
LAB_001e0ffc:
    return false;
  }
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar7 = *(int *)(field + 0x50) == 0;
    break;
  case 2:
  case 4:
    bVar7 = *(long *)(field + 0x50) == 0;
    break;
  case 5:
    bVar4 = *(double *)(field + 0x50) == 0.0;
    goto LAB_001e0ff2;
  case 6:
    bVar4 = *(float *)(field + 0x50) == 0.0;
LAB_001e0ff2:
    bVar7 = -bVar4 & 1;
    break;
  case 7:
    bVar7 = (byte)field[0x50] ^ 1;
    break;
  case 8:
    lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
    bVar7 = *(int *)(lVar3 + 4) == 0;
    break;
  default:
    goto LAB_001e0ffc;
  }
  return (bool)bVar7;
}

Assistant:

bool CanClearByZeroing(const FieldDescriptor* field) {
  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    default:
      return false;
  }
}